

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O1

ssize_t archive_acl_text_len
                  (archive_acl *acl,wchar_t want_type,wchar_t flags,wchar_t wide,archive *a,
                  archive_string_conv *sc)

{
  bool bVar1;
  wchar_t wVar2;
  size_t sVar3;
  int *piVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  ssize_t sVar8;
  int iVar9;
  archive_acl_entry *paVar10;
  size_t len;
  wchar_t *wname;
  char *name;
  size_t local_48;
  wchar_t *local_40;
  char *local_38;
  
  paVar10 = acl->acl_head;
  if (paVar10 == (archive_acl_entry *)0x0) {
    lVar6 = 0;
    sVar8 = 0;
  }
  else {
    lVar6 = 0;
    iVar9 = 0;
    do {
      wVar2 = paVar10->type;
      if (((wVar2 & want_type) == 0) ||
         (((wVar2 == L'Ā' && (uVar5 = paVar10->tag + L'\xffffd8ee', uVar5 < 5)) &&
          ((0x15U >> (uVar5 & 0x1f) & 1) != 0)))) goto LAB_0066ddb9;
      lVar6 = lVar6 + (ulong)((uint)(wVar2 & want_type) >> 6 & 8);
      wVar2 = paVar10->tag;
      switch(wVar2) {
      case L'✑':
      case L'✕':
switchD_0066dc59_caseD_2711:
        lVar6 = lVar6 + 4;
        break;
      case L'✒':
        if (want_type != L'㰀') goto switchD_0066dc59_caseD_2711;
LAB_0066dc82:
        lVar6 = lVar6 + 6;
        break;
      case L'✔':
        if (want_type == L'㰀') goto LAB_0066dc82;
      case L'✓':
      case L'✖':
        lVar6 = lVar6 + 5;
        break;
      default:
        if (wVar2 == L'❻') {
          lVar6 = lVar6 + 9;
        }
      }
      lVar7 = lVar6 + 1;
      if ((wVar2 | 2U) == 0x2713) {
        if (wide == L'\0') {
          wVar2 = archive_mstring_get_mbs_l(a,&paVar10->name,&local_38,&local_48,sc);
          if (wVar2 != L'\0') {
            return 0;
          }
          if ((local_48 == 0) || (local_38 == (char *)0x0)) goto LAB_0066dd36;
          lVar7 = local_48 + lVar7;
        }
        else {
          wVar2 = archive_mstring_get_wcs(a,&paVar10->name,&local_40);
          if (local_40 == (wchar_t *)0x0 || wVar2 != L'\0') {
            if ((wVar2 < L'\0') && (piVar4 = __errno_location(), *piVar4 == 0xc)) {
              return 0;
            }
LAB_0066dd36:
            lVar7 = lVar6 + 0xe;
          }
          else {
            sVar3 = wcslen(local_40);
            lVar7 = sVar3 + lVar7;
          }
        }
        lVar6 = lVar7 + 1;
      }
      else {
        lVar6 = lVar6 + 2;
        if (want_type == L'㰀') {
          lVar6 = lVar7;
        }
      }
      if ((want_type & 0x300U) != 0 && (flags & 4U) != 0) {
        lVar6 = lVar6 - (ulong)((uint)(paVar10->tag + L'\xffffd8eb') < 2);
      }
      if (want_type == L'㰀') {
        lVar6 = lVar6 + 0x1b + (ulong)((paVar10->type & L'ࠀ') == L'\0');
      }
      else {
        lVar6 = lVar6 + 3;
      }
      if (((paVar10->tag | 2U) == 0x2713) && ((flags & 1U) != 0)) {
        lVar7 = 1;
        wVar2 = paVar10->id;
        if (L'\t' < paVar10->id) {
          do {
            lVar7 = lVar7 + 1;
            bVar1 = 99 < (uint)wVar2;
            wVar2 = (uint)wVar2 / 10;
          } while (bVar1);
        }
        lVar6 = lVar6 + 1 + lVar7;
      }
      iVar9 = iVar9 + 1;
      lVar6 = lVar6 + 1;
LAB_0066ddb9:
      paVar10 = paVar10->next;
    } while (paVar10 != (archive_acl_entry *)0x0);
    sVar8 = 0;
    if (iVar9 != 0) {
      sVar8 = lVar6;
    }
  }
  if (((uint)want_type >> 8 & 1) != 0) {
    if ((flags & 4U) == 0) {
      sVar8 = lVar6 + 0x20;
    }
    else {
      sVar8 = lVar6 + 0x1f;
    }
  }
  return sVar8;
}

Assistant:

static ssize_t
archive_acl_text_len(struct archive_acl *acl, int want_type, int flags,
    int wide, struct archive *a, struct archive_string_conv *sc) {
	struct archive_acl_entry *ap;
	const char *name;
	const wchar_t *wname;
	int count, idlen, tmp, r;
	ssize_t length;
	size_t len;

	count = 0;
	length = 0;
	for (ap = acl->acl_head; ap != NULL; ap = ap->next) {
		if ((ap->type & want_type) == 0)
			continue;
		/*
		 * Filemode-mapping ACL entries are stored exclusively in
		 * ap->mode so they should not be in the list
		 */
		if ((ap->type == ARCHIVE_ENTRY_ACL_TYPE_ACCESS)
		    && (ap->tag == ARCHIVE_ENTRY_ACL_USER_OBJ
		    || ap->tag == ARCHIVE_ENTRY_ACL_GROUP_OBJ
		    || ap->tag == ARCHIVE_ENTRY_ACL_OTHER))
			continue;
		count++;
		if ((want_type & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT) != 0
		    && (ap->type & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT) != 0)
			length += 8; /* "default:" */
		switch (ap->tag) {
		case ARCHIVE_ENTRY_ACL_USER_OBJ:
			if (want_type == ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
				length += 6; /* "owner@" */
				break;
			}
			/* FALLTHROUGH */
		case ARCHIVE_ENTRY_ACL_USER:
		case ARCHIVE_ENTRY_ACL_MASK:
			length += 4; /* "user", "mask" */
			break;
		case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
			if (want_type == ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
				length += 6; /* "group@" */
				break;
			}
			/* FALLTHROUGH */
		case ARCHIVE_ENTRY_ACL_GROUP:
		case ARCHIVE_ENTRY_ACL_OTHER:
			length += 5; /* "group", "other" */
			break;
		case ARCHIVE_ENTRY_ACL_EVERYONE:
			length += 9; /* "everyone@" */
			break;
		}
		length += 1; /* colon after tag */
		if (ap->tag == ARCHIVE_ENTRY_ACL_USER ||
		    ap->tag == ARCHIVE_ENTRY_ACL_GROUP) {
			if (wide) {
				r = archive_mstring_get_wcs(a, &ap->name,
				    &wname);
				if (r == 0 && wname != NULL)
					length += wcslen(wname);
				else if (r < 0 && errno == ENOMEM)
					return (0);
				else
					length += sizeof(uid_t) * 3 + 1;
			} else {
				r = archive_mstring_get_mbs_l(a, &ap->name, &name,
				    &len, sc);
				if (r != 0)
					return (0);
				if (len > 0 && name != NULL)
					length += len;
				else
					length += sizeof(uid_t) * 3 + 1;
			}
			length += 1; /* colon after user or group name */
		} else if (want_type != ARCHIVE_ENTRY_ACL_TYPE_NFS4)
			length += 1; /* 2nd colon empty user,group or other */

		if (((flags & ARCHIVE_ENTRY_ACL_STYLE_SOLARIS) != 0)
		    && ((want_type & ARCHIVE_ENTRY_ACL_TYPE_POSIX1E) != 0)
		    && (ap->tag == ARCHIVE_ENTRY_ACL_OTHER
		    || ap->tag == ARCHIVE_ENTRY_ACL_MASK)) {
			/* Solaris has no colon after other: and mask: */
			length = length - 1;
		}

		if (want_type == ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
			/* rwxpdDaARWcCos:fdinSFI:deny */
			length += 27;
			if ((ap->type & ARCHIVE_ENTRY_ACL_TYPE_DENY) == 0)
				length += 1; /* allow, alarm, audit */
		} else
			length += 3; /* rwx */

		if ((ap->tag == ARCHIVE_ENTRY_ACL_USER ||
		    ap->tag == ARCHIVE_ENTRY_ACL_GROUP) &&
		    (flags & ARCHIVE_ENTRY_ACL_STYLE_EXTRA_ID) != 0) {
			length += 1; /* colon */
			/* ID digit count */
			idlen = 1;
			tmp = ap->id;
			while (tmp > 9) {
				tmp = tmp / 10;
				idlen++;
			}
			length += idlen;
		}
		length ++; /* entry separator */
	}

	/* Add filemode-mapping access entries to the length */
	if ((want_type & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0) {
		if ((flags & ARCHIVE_ENTRY_ACL_STYLE_SOLARIS) != 0) {
			/* "user::rwx\ngroup::rwx\nother:rwx\n" */
			length += 31;
		} else {
			/* "user::rwx\ngroup::rwx\nother::rwx\n" */
			length += 32;
		}
	} else if (count == 0)
		return (0);

	/* The terminating character is included in count */
	return (length);
}